

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpHeaders::HttpHeaders(HttpHeaders *this,HttpHeaderTable *table)

{
  this->table = table;
  heapArray<kj::StringPtr>
            (&this->indexedHeaders,
             (ulong)((long)(table->namesById).builder.pos - (long)(table->namesById).builder.ptr) >>
             4 & 0xffffffff);
  (this->unindexedHeaders).builder.ptr = (Header *)0x0;
  (this->unindexedHeaders).builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  (this->unindexedHeaders).builder.endPtr = (Header *)0x0;
  (this->ownedStrings).builder.ptr = (Array<char> *)0x0;
  (this->ownedStrings).builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
  (this->ownedStrings).builder.endPtr = (Array<char> *)0x0;
  return;
}

Assistant:

HttpHeaders::HttpHeaders(const HttpHeaderTable& table)
    : table(&table),
      indexedHeaders(kj::heapArray<kj::StringPtr>(table.idCount())) {}